

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O3

void __thiscall
IntrusiveListIteratorTest_crbegin_crend_backward_Test::
~IntrusiveListIteratorTest_crbegin_crend_backward_Test
          (IntrusiveListIteratorTest_crbegin_crend_backward_Test *this)

{
  TestObject *pTVar1;
  TestObject *pTVar2;
  
  (this->super_IntrusiveListIteratorTest).super_IntrusiveListTest.super_Test._vptr_Test =
       (_func_int **)&PTR__IntrusiveListIteratorTest_002bed98;
  pTVar2 = (this->super_IntrusiveListIteratorTest).list_.first_;
  while (pTVar2 != (TestObject *)0x0) {
    if (pTVar2->moved == false) {
      (anonymous_namespace)::TestObject::creation_count =
           (anonymous_namespace)::TestObject::creation_count + -1;
    }
    pTVar1 = (pTVar2->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
    operator_delete(pTVar2);
    pTVar2 = pTVar1;
  }
  (this->super_IntrusiveListIteratorTest).list_.first_ = (TestObject *)0x0;
  (this->super_IntrusiveListIteratorTest).list_.last_ = (TestObject *)0x0;
  (this->super_IntrusiveListIteratorTest).list_.size_ = 0;
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, crbegin_crend_backward) {
  TestBackward(list_.crbegin(), list_.crend(), {1, 2, 3});
  TestBackward(clist_.crbegin(), clist_.crend(), {1, 2, 3});
}